

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log-demo.cpp
# Opt level: O3

int main(void)

{
  Logger *pLVar1;
  double dVar2;
  undefined8 uVar3;
  Logger *this;
  uint64_t uVar4;
  int iVar5;
  unique_ptr<tlog::Logger,_std::default_delete<tlog::Logger>_> *puVar6;
  int *piVar7;
  long lVar8;
  long lVar9;
  shared_ptr<tlog::ConsoleOutput> *psVar10;
  duration<long,_std::ratio<1L,_1000000L>_> dur;
  int i;
  uint64_t uVar11;
  int i_1;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  initializer_list<std::shared_ptr<tlog::IOutput>_> __l;
  Progress progress;
  Logger scopedLogger;
  undefined1 local_160 [24];
  uint64_t uStack_148;
  allocator_type local_139;
  Progress local_138;
  Stream local_118;
  undefined1 local_100 [96];
  _Alloc_hider local_a0;
  char *local_90 [2];
  string local_80;
  _Rb_tree<std::shared_ptr<tlog::IOutput>,_std::shared_ptr<tlog::IOutput>,_std::_Identity<std::shared_ptr<tlog::IOutput>_>,_std::less<std::shared_ptr<tlog::IOutput>_>,_std::allocator<std::shared_ptr<tlog::IOutput>_>_>
  local_60;
  
  puVar6 = tlog::Logger::global();
  tlog::Stream::Stream
            ((Stream *)local_160,
             (puVar6->_M_t).super___uniq_ptr_impl<tlog::Logger,_std::default_delete<tlog::Logger>_>.
             _M_t.super__Tuple_impl<0UL,_tlog::Logger_*,_std::default_delete<tlog::Logger>_>.
             super__Head_base<0UL,_tlog::Logger_*,_false>._M_head_impl,None);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_160._16_8_,"===========================================\n",0x2c);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_160._16_8_,"===== tinylogger demo =====================\n",0x2c);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_160._16_8_,"===========================================",0x2b);
  uVar3 = local_160._0_8_;
  if ((ostream *)local_160._16_8_ != (ostream *)0x0) {
    dVar2 = (double)std::__cxx11::stringbuf::str();
    tlog::Logger::log((Logger *)uVar3,dVar2);
    if ((undefined1 *)local_100._0_8_ != local_100 + 0x10) {
      operator_delete((void *)local_100._0_8_);
    }
    if ((_Tuple_impl<0UL,_std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )local_160._16_8_ !=
        (basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_160._16_8_ + 8))();
    }
  }
  puVar6 = tlog::Logger::global();
  tlog::Stream::Stream
            ((Stream *)local_160,
             (puVar6->_M_t).super___uniq_ptr_impl<tlog::Logger,_std::default_delete<tlog::Logger>_>.
             _M_t.super__Tuple_impl<0UL,_tlog::Logger_*,_std::default_delete<tlog::Logger>_>.
             super__Head_base<0UL,_tlog::Logger_*,_false>._M_head_impl,Info);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_160._16_8_,"This is an info message meant to let you know ",0x2e);
  std::ostream::operator<<((ostream *)local_160._16_8_,0x2a);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_160._16_8_,
             " is the Answer to the Ultimate Question of Life, the Universe, and Everything",0x4d);
  uVar3 = local_160._0_8_;
  if ((_Tuple_impl<0UL,_std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )local_160._16_8_ !=
      (basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    dVar2 = (double)std::__cxx11::stringbuf::str();
    tlog::Logger::log((Logger *)uVar3,dVar2);
    if ((undefined1 *)local_100._0_8_ != local_100 + 0x10) {
      operator_delete((void *)local_100._0_8_);
    }
    if ((ostream *)local_160._16_8_ != (ostream *)0x0) {
      (**(code **)(*(long *)local_160._16_8_ + 8))();
    }
  }
  puVar6 = tlog::Logger::global();
  tlog::Stream::Stream
            ((Stream *)local_160,
             (puVar6->_M_t).super___uniq_ptr_impl<tlog::Logger,_std::default_delete<tlog::Logger>_>.
             _M_t.super__Tuple_impl<0UL,_tlog::Logger_*,_std::default_delete<tlog::Logger>_>.
             super__Head_base<0UL,_tlog::Logger_*,_false>._M_head_impl,Debug);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_160._16_8_,
             "You can only see this message if this demo has been compiled in debug mode.",0x4b);
  uVar3 = local_160._0_8_;
  if ((_Tuple_impl<0UL,_std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )local_160._16_8_ !=
      (basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    dVar2 = (double)std::__cxx11::stringbuf::str();
    tlog::Logger::log((Logger *)uVar3,dVar2);
    if ((undefined1 *)local_100._0_8_ != local_100 + 0x10) {
      operator_delete((void *)local_100._0_8_);
    }
    if ((basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_160._16_8_
        != (basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_160._16_8_ + 8))();
    }
  }
  puVar6 = tlog::Logger::global();
  tlog::Stream::Stream
            ((Stream *)local_160,
             (puVar6->_M_t).super___uniq_ptr_impl<tlog::Logger,_std::default_delete<tlog::Logger>_>.
             _M_t.super__Tuple_impl<0UL,_tlog::Logger_*,_std::default_delete<tlog::Logger>_>.
             super__Head_base<0UL,_tlog::Logger_*,_false>._M_head_impl,Warning);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_160._16_8_,"This ",5);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_160._16_8_,"is ",3);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_160._16_8_,"a ",2);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_160._16_8_,"warning!",8);
  uVar3 = local_160._0_8_;
  if ((ostream *)local_160._16_8_ != (ostream *)0x0) {
    dVar2 = (double)std::__cxx11::stringbuf::str();
    tlog::Logger::log((Logger *)uVar3,dVar2);
    if ((undefined1 *)local_100._0_8_ != local_100 + 0x10) {
      operator_delete((void *)local_100._0_8_);
    }
    if ((ostream *)local_160._16_8_ != (ostream *)0x0) {
      (**(code **)(*(long *)local_160._16_8_ + 8))();
    }
  }
  puVar6 = tlog::Logger::global();
  tlog::Stream::Stream
            ((Stream *)local_160,
             (puVar6->_M_t).super___uniq_ptr_impl<tlog::Logger,_std::default_delete<tlog::Logger>_>.
             _M_t.super__Tuple_impl<0UL,_tlog::Logger_*,_std::default_delete<tlog::Logger>_>.
             super__Head_base<0UL,_tlog::Logger_*,_false>._M_head_impl,Error);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_160._16_8_,
             "This is an error message that is so long, it likely does not fit within a single line. "
             ,0x57);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_160._16_8_,
             "The purpose of this message is to make sure line breaks do not break anything (get it?). "
             ,0x59);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_160._16_8_,
             "This sentence only exists to make this message even longer.",0x3b);
  uVar3 = local_160._0_8_;
  if ((ostream *)local_160._16_8_ != (ostream *)0x0) {
    dVar2 = (double)std::__cxx11::stringbuf::str();
    tlog::Logger::log((Logger *)uVar3,dVar2);
    if ((undefined1 *)local_100._0_8_ != local_100 + 0x10) {
      operator_delete((void *)local_100._0_8_);
    }
    if ((ostream *)local_160._16_8_ != (ostream *)0x0) {
      (**(code **)(*(long *)local_160._16_8_ + 8))();
    }
  }
  puVar6 = tlog::Logger::global();
  tlog::Stream::Stream
            ((Stream *)local_160,
             (puVar6->_M_t).super___uniq_ptr_impl<tlog::Logger,_std::default_delete<tlog::Logger>_>.
             _M_t.super__Tuple_impl<0UL,_tlog::Logger_*,_std::default_delete<tlog::Logger>_>.
             super__Head_base<0UL,_tlog::Logger_*,_false>._M_head_impl,Info);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_160._16_8_,"Demonstrating a progress bar...",0x1f);
  uVar3 = local_160._0_8_;
  if ((ostream *)local_160._16_8_ != (ostream *)0x0) {
    dVar2 = (double)std::__cxx11::stringbuf::str();
    tlog::Logger::log((Logger *)uVar3,dVar2);
    if ((undefined1 *)local_100._0_8_ != local_100 + 0x10) {
      operator_delete((void *)local_100._0_8_);
    }
    if ((_Tuple_impl<0UL,_std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )local_160._16_8_ !=
        (basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_160._16_8_ + 8))();
    }
  }
  puVar6 = tlog::Logger::global();
  tlog::Progress::Progress
            (&local_138,
             (puVar6->_M_t).super___uniq_ptr_impl<tlog::Logger,_std::default_delete<tlog::Logger>_>.
             _M_t.super__Tuple_impl<0UL,_tlog::Logger_*,_std::default_delete<tlog::Logger>_>.
             super__Head_base<0UL,_tlog::Logger_*,_false>._M_head_impl,100);
  uVar11 = 1;
  do {
    local_100._0_8_ = (char **)0x0;
    local_100._8_8_ = 10000000;
    do {
      iVar5 = nanosleep((timespec *)local_100,(timespec *)local_100);
      if (iVar5 != -1) break;
      piVar7 = __errno_location();
    } while (*piVar7 == 4);
    uVar4 = local_138.mTotal;
    pLVar1 = local_138.mLogger;
    local_138.mCurrent = uVar11;
    lVar8 = std::chrono::_V2::steady_clock::now();
    tlog::Logger::progress<std::chrono::duration<long,std::ratio<1l,1000000l>>>
              (pLVar1,uVar11,uVar4,
               (duration<long,_std::ratio<1L,_1000000L>_>)
               ((lVar8 - (long)local_138.mStartTime.__d.__r) / 1000));
    uVar11 = uVar11 + 1;
  } while (uVar11 != 0x65);
  puVar6 = tlog::Logger::global();
  tlog::Stream::Stream
            ((Stream *)local_160,
             (puVar6->_M_t).super___uniq_ptr_impl<tlog::Logger,_std::default_delete<tlog::Logger>_>.
             _M_t.super__Tuple_impl<0UL,_tlog::Logger_*,_std::default_delete<tlog::Logger>_>.
             super__Head_base<0UL,_tlog::Logger_*,_false>._M_head_impl,Success);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_160._16_8_,"Progress finished after ",0x18);
  lVar9 = std::chrono::_V2::steady_clock::now();
  lVar8 = lVar9 - (long)local_138.mStartTime.__d.__r >> 0x3f;
  dur.__r = (lVar9 - (long)local_138.mStartTime.__d.__r) / 1000 + lVar8;
  tlog::durationToString<std::chrono::duration<long,std::ratio<1l,1000000l>>>
            ((string *)local_100,(tlog *)(dur.__r - lVar8),dur);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_160._16_8_,(char *)local_100._0_8_,local_100._8_8_);
  if ((undefined1 *)local_100._0_8_ != local_100 + 0x10) {
    operator_delete((void *)local_100._0_8_);
  }
  if ((ostream *)local_160._16_8_ != (ostream *)0x0) {
    dVar2 = (double)std::__cxx11::stringbuf::str();
    tlog::Logger::log((Logger *)local_160._0_8_,dVar2);
    if ((undefined1 *)local_100._0_8_ != local_100 + 0x10) {
      operator_delete((void *)local_100._0_8_);
    }
    if ((ostream *)local_160._16_8_ != (ostream *)0x0) {
      (**(code **)(*(long *)local_160._16_8_ + 8))();
    }
  }
  local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"inner scope","");
  psVar10 = tlog::ConsoleOutput::global();
  local_160._0_8_ =
       (psVar10->super___shared_ptr<tlog::ConsoleOutput,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_160._8_8_ =
       (psVar10->super___shared_ptr<tlog::ConsoleOutput,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
       _M_pi;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_160._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_160._8_8_)->_M_use_count =
           ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_160._8_8_)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_160._8_8_)->_M_use_count =
           ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_160._8_8_)->_M_use_count + 1;
    }
  }
  __l._M_len = 1;
  __l._M_array = (iterator)local_160;
  std::
  set<std::shared_ptr<tlog::IOutput>,_std::less<std::shared_ptr<tlog::IOutput>_>,_std::allocator<std::shared_ptr<tlog::IOutput>_>_>
  ::set((set<std::shared_ptr<tlog::IOutput>,_std::less<std::shared_ptr<tlog::IOutput>_>,_std::allocator<std::shared_ptr<tlog::IOutput>_>_>
         *)&local_60,__l,(less<std::shared_ptr<tlog::IOutput>_> *)&local_118,&local_139);
  tlog::Logger::Logger
            ((Logger *)local_100,&local_80,
             (set<std::shared_ptr<tlog::IOutput>,_std::less<std::shared_ptr<tlog::IOutput>_>,_std::allocator<std::shared_ptr<tlog::IOutput>_>_>
              *)&local_60);
  std::
  _Rb_tree<std::shared_ptr<tlog::IOutput>,_std::shared_ptr<tlog::IOutput>,_std::_Identity<std::shared_ptr<tlog::IOutput>_>,_std::less<std::shared_ptr<tlog::IOutput>_>,_std::allocator<std::shared_ptr<tlog::IOutput>_>_>
  ::~_Rb_tree(&local_60);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_160._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_160._8_8_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != &local_80.field_2) {
    operator_delete(local_80._M_dataplus._M_p);
  }
  pLVar1 = (Logger *)(local_160 + 0x10);
  local_160._0_8_ = pLVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_160,"This info message is written by a scoped logger.","");
  tlog::Logger::log((Logger *)local_100,(double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da));
  if ((Logger *)local_160._0_8_ != pLVar1) {
    operator_delete((void *)local_160._0_8_);
  }
  tlog::Progress::Progress((Progress *)local_160,(Logger *)local_100,100);
  local_138.mTotal = local_160._16_8_;
  local_138.mCurrent = uStack_148;
  local_138.mLogger = (Logger *)local_160._0_8_;
  local_138.mStartTime.__d.__r = (duration)(duration)local_160._8_8_;
  uVar11 = 1;
  do {
    local_160._0_8_ = (Logger *)0x0;
    local_160._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x989680;
    do {
      iVar5 = nanosleep((timespec *)local_160,(timespec *)local_160);
      if (iVar5 != -1) break;
      piVar7 = __errno_location();
    } while (*piVar7 == 4);
    uVar4 = local_138.mTotal;
    this = local_138.mLogger;
    local_138.mCurrent = uVar11;
    lVar8 = std::chrono::_V2::steady_clock::now();
    tlog::Logger::progress<std::chrono::duration<long,std::ratio<1l,1000000l>>>
              (this,uVar11,uVar4,
               (duration<long,_std::ratio<1L,_1000000L>_>)
               ((lVar8 - (long)local_138.mStartTime.__d.__r) / 1000));
    uVar11 = uVar11 + 1;
    if (uVar11 == 0x65) {
      local_160._0_8_ = pLVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_160,"Now you know how to use scoped loggers!","");
      tlog::Logger::log((Logger *)local_100,
                        (double)CONCAT44(extraout_XMM0_Db_00,extraout_XMM0_Da_00));
      if ((Logger *)local_160._0_8_ != pLVar1) {
        operator_delete((void *)local_160._0_8_);
      }
      puVar6 = tlog::Logger::global();
      tlog::Stream::Stream
                (&local_118,
                 (puVar6->_M_t).
                 super___uniq_ptr_impl<tlog::Logger,_std::default_delete<tlog::Logger>_>._M_t.
                 super__Tuple_impl<0UL,_tlog::Logger_*,_std::default_delete<tlog::Logger>_>.
                 super__Head_base<0UL,_tlog::Logger_*,_false>._M_head_impl,Success);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)
                 local_118.mText._M_t.
                 super___uniq_ptr_impl<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 .
                 super__Head_base<0UL,_std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                 ._M_head_impl,"The demo application terminated successfully. Hooray!",0x35);
      if ((_Tuple_impl<0UL,_std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )local_118.mText._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl !=
          (basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        dVar2 = (double)std::__cxx11::stringbuf::str();
        tlog::Logger::log(local_118.mLogger,dVar2);
        if ((Logger *)local_160._0_8_ != pLVar1) {
          operator_delete((void *)local_160._0_8_);
        }
        if (local_118.mText._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl !=
            (__uniq_ptr_impl<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )0x0) {
          (**(code **)(*(long *)local_118.mText._M_t.
                                super___uniq_ptr_impl<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                .
                                super__Head_base<0UL,_std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                ._M_head_impl + 8))();
        }
      }
      if ((char **)local_a0._M_p != local_90) {
        operator_delete(local_a0._M_p);
      }
      std::
      _Rb_tree<std::shared_ptr<tlog::IOutput>,_std::shared_ptr<tlog::IOutput>,_std::_Identity<std::shared_ptr<tlog::IOutput>_>,_std::less<std::shared_ptr<tlog::IOutput>_>,_std::allocator<std::shared_ptr<tlog::IOutput>_>_>
      ::~_Rb_tree((_Rb_tree<std::shared_ptr<tlog::IOutput>,_std::shared_ptr<tlog::IOutput>,_std::_Identity<std::shared_ptr<tlog::IOutput>_>,_std::less<std::shared_ptr<tlog::IOutput>_>,_std::allocator<std::shared_ptr<tlog::IOutput>_>_>
                   *)(local_100 + 0x30));
      std::
      _Rb_tree<tlog::ESeverity,_tlog::ESeverity,_std::_Identity<tlog::ESeverity>,_std::less<tlog::ESeverity>,_std::allocator<tlog::ESeverity>_>
      ::~_Rb_tree((_Rb_tree<tlog::ESeverity,_tlog::ESeverity,_std::_Identity<tlog::ESeverity>,_std::less<tlog::ESeverity>,_std::allocator<tlog::ESeverity>_>
                   *)local_100);
      return 0;
    }
  } while( true );
}

Assistant:

int main() {
    tlog::none()
        << "===========================================\n"
        << "===== tinylogger demo =====================\n"
        << "===========================================";

    tlog::info()
        << "This is an info message meant to let you know "
        << 42 <<
        " is the Answer to the Ultimate Question of Life, the Universe, and Everything";

    tlog::debug() << "You can only see this message if this demo has been compiled in debug mode.";

    tlog::warning() << "This " << "is " << "a " << "warning!";

    tlog::error()
        << "This is an error message that is so long, it likely does not fit within a single line. "
        << "The purpose of this message is to make sure line breaks do not break anything (get it?). "
        << "This sentence only exists to make this message even longer.";

    tlog::info() << "Demonstrating a progress bar...";

    static const int N = 100;

    auto progress = tlog::progress(N);
    for (int i = 1; i <= N; ++i) {
        std::this_thread::sleep_for(std::chrono::milliseconds{10});
        progress.update(i);
    }

    tlog::success() << "Progress finished after " << tlog::durationToString(progress.duration());

    auto scopedLogger = tlog::Logger("inner scope");
    scopedLogger.info("This info message is written by a scoped logger.");
    progress = scopedLogger.progress(N);
    for (int i = 1; i <= N; ++i) {
        std::this_thread::sleep_for(std::chrono::milliseconds{10});
        progress.update(i);
    }
    scopedLogger.success("Now you know how to use scoped loggers!");

    tlog::success() << "The demo application terminated successfully. Hooray!";
}